

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

bool __thiscall S2Polygon::Equals(S2Polygon *this,S2Polygon *b)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  _Head_base<0UL,_S2Loop_*,_false> b_00;
  _Head_base<0UL,_S2Loop_*,_false> this_00;
  long lVar6;
  
  if ((int)((ulong)((long)(this->loops_).
                          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->loops_).
                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) ==
      (int)((ulong)((long)(b->loops_).
                          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(b->loops_).
                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    puVar1 = (this->loops_).
             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = (int)((ulong)((long)(this->loops_).
                                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3);
    bVar5 = iVar3 < 1;
    if (0 < iVar3) {
      b_00._M_head_impl =
           *(S2Loop **)
            &(puVar1->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
      this_00._M_head_impl =
           *(S2Loop **)
            &(((b->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
      if (*(int *)((long)this_00._M_head_impl + 8) == *(int *)((long)b_00._M_head_impl + 8)) {
        lVar6 = 1;
        do {
          bVar2 = S2Loop::Equals(this_00._M_head_impl,b_00._M_head_impl);
          if (!bVar2) {
            return bVar5;
          }
          puVar1 = (this->loops_).
                   super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar4 = (long)(int)((ulong)((long)(this->loops_).
                                            super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)puVar1) >> 3);
          bVar5 = lVar4 <= lVar6;
          if (lVar4 <= lVar6) {
            return bVar5;
          }
          b_00._M_head_impl =
               *(S2Loop **)
                &puVar1[lVar6]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t
          ;
          this_00._M_head_impl =
               *(S2Loop **)
                &(b->loops_).
                 super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
                 super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
          lVar6 = lVar6 + 1;
        } while (*(int *)((long)this_00._M_head_impl + 8) == *(int *)((long)b_00._M_head_impl + 8));
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

void S2Polygon::InitToUnion(
    const S2Polygon& a, const S2Polygon& b,
    const S2Builder::SnapFunction& snap_function) {
  InitToOperation(S2BooleanOperation::OpType::UNION, snap_function, a, b);
}